

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

void __thiscall deqp::gls::AttributePack::~AttributePack(AttributePack *this)

{
  pointer ppAVar1;
  
  clearArrays(this);
  if (this->m_programID != 0) {
    (*this->m_ctx->_vptr_Context[0x77])();
  }
  if (this->m_program != (ShaderProgram *)0x0) {
    (*(this->m_program->super_VertexShader)._vptr_VertexShader[2])();
  }
  if (this->m_useVao == true) {
    (*this->m_ctx->_vptr_Context[0x4d])(this->m_ctx,1,&this->m_vaoID);
  }
  tcu::Surface::~Surface(&this->m_screen);
  ppAVar1 = (this->m_arrays).
            super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar1 != (pointer)0x0) {
    operator_delete(ppAVar1,(long)(this->m_arrays).
                                  super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar1
                   );
    return;
  }
  return;
}

Assistant:

AttributePack::~AttributePack (void)
{
	clearArrays();

	if (m_programID)
		m_ctx.deleteProgram(m_programID);

	if (m_program)
		delete m_program;

	if (m_useVao)
		m_ctx.deleteVertexArrays(1, &m_vaoID);
}